

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::TokenManager::ValidateToken
          (Error *__return_storage_ptr__,TokenManager *this,CborMap *aToken,ByteArray *aSignedToken,
          mbedtls_pk_context_conflict *aPublicKey)

{
  string *this_00;
  char cVar1;
  ErrorCode EVar2;
  undefined1 auVar3 [8];
  int iVar4;
  uint8_t *aBuf;
  char *pcVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar7;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  size_t domainNameLength;
  char *domainName;
  Sign1Message coseSign;
  CborMap token;
  size_t payloadLength;
  writer write;
  size_t expireLength;
  char *expire;
  undefined1 local_128 [8];
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  parse_func local_100 [1];
  undefined1 local_f0 [32];
  size_t local_d0;
  char *local_c8;
  Sign1Message local_c0;
  CborValue local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_t local_90;
  format_string_checker<char> *local_88;
  size_type *psStack_80;
  pointer local_78;
  size_type asStack_70 [2];
  writer local_60;
  size_type *psStack_58;
  size_t local_40;
  char *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_98 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_98;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  cose::Sign1Message::Sign1Message(&local_c0);
  CborValue::CborValue(&local_b0);
  local_b0._vptr_CborValue = (_func_int **)&PTR__CborValue_0028ad40;
  if ((aSignedToken->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (aSignedToken->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_128 = (undefined1  [8])((ulong)local_128 & 0xffffffff00000000);
    local_120._M_p = "the signed COM_TOK is empty";
    local_118 = 0x1b;
    local_110._M_allocated_capacity = 0;
    local_100[0] = (parse_func)0x0;
    pcVar5 = "the signed COM_TOK is empty";
    local_110._8_8_ = (format_string_checker<char> *)local_128;
    do {
      pcVar6 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",(format_string_checker<char> *)local_128);
      }
      pcVar5 = pcVar6;
    } while (pcVar6 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_128;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_f0,(v10 *)"the signed COM_TOK is empty",(string_view)ZEXT816(0x1b),
               args);
    local_88 = (format_string_checker<char> *)CONCAT44(local_88._4_4_,2);
    psStack_80 = asStack_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&psStack_80,local_f0._0_8_,(pointer)(local_f0._0_8_ + local_f0._8_8_));
LAB_001c4717:
    __return_storage_ptr__->mCode = (ErrorCode)local_88;
    std::__cxx11::string::operator=((string *)this_00,(string *)&psStack_80);
    if (psStack_80 != asStack_70) {
      operator_delete(psStack_80);
    }
    if ((format_string_checker<char> *)local_f0._0_8_ ==
        (format_string_checker<char> *)(local_f0 + 0x10)) goto LAB_001c4751;
  }
  else {
    cose::Sign1Message::Deserialize((Error *)local_128,&local_c0,aSignedToken);
    __return_storage_ptr__->mCode = local_128._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_120);
    EVar2 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_p != &local_110) {
      operator_delete(local_120._M_p);
    }
    if (EVar2 != kNone) goto LAB_001c4751;
    cose::Sign1Message::Validate((Error *)local_128,&local_c0,(mbedtls_pk_context *)aPublicKey);
    __return_storage_ptr__->mCode = local_128._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_120);
    EVar2 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_p != &local_110) {
      operator_delete(local_120._M_p);
    }
    if (EVar2 != kNone) goto LAB_001c4751;
    aBuf = cose::Sign1Message::GetPayload(&local_c0,&local_90);
    if (aBuf == (uint8_t *)0x0) {
      local_128 = (undefined1  [8])((ulong)local_128 & 0xffffffff00000000);
      pcVar5 = "cannot find payload in the signed COM_TOK";
      local_120._M_p = "cannot find payload in the signed COM_TOK";
      local_118 = 0x29;
      local_110._M_allocated_capacity = 0;
      local_100[0] = (parse_func)0x0;
      local_110._8_8_ = (format_string_checker<char> *)local_128;
      local_60.handler_ = (format_string_checker<char> *)local_128;
      do {
        cVar1 = *pcVar5;
        pcVar6 = pcVar5;
        while (cVar1 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_60,pcVar5,"");
            goto LAB_001c4818;
          }
          cVar1 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_60,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_128);
      } while (pcVar5 != "");
LAB_001c4818:
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)local_128;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_f0,(v10 *)"cannot find payload in the signed COM_TOK",
                 (string_view)ZEXT816(0x29),args_00);
      local_88 = (format_string_checker<char> *)CONCAT44(local_88._4_4_,8);
      psStack_80 = asStack_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&psStack_80,local_f0._0_8_,(pointer)(local_f0._0_8_ + local_f0._8_8_));
      goto LAB_001c4717;
    }
    CborValue::Deserialize((Error *)local_128,&local_b0,aBuf,local_90);
    __return_storage_ptr__->mCode = local_128._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_120);
    EVar2 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_p != &local_110) {
      operator_delete(local_120._M_p);
    }
    if (EVar2 != kNone) goto LAB_001c4751;
    CborMap::Get((Error *)local_128,(CborMap *)&local_b0,3,&local_c8,&local_d0);
    __return_storage_ptr__->mCode = local_128._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_120);
    EVar2 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_p != &local_110) {
      operator_delete(local_120._M_p);
    }
    if (EVar2 != kNone) goto LAB_001c4751;
    CborMap::Get((Error *)local_128,(CborMap *)&local_b0,4,&local_38,&local_40);
    __return_storage_ptr__->mCode = local_128._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_120);
    EVar2 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_p != &local_110) {
      operator_delete(local_120._M_p);
    }
    if (EVar2 != kNone) goto LAB_001c4751;
    local_128 = (undefined1  [8])&local_118;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,local_c8,local_c8 + local_d0);
    auVar3 = local_128;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(this->mDomainName)._M_string_length) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar7 = false;
      }
      else {
        iVar4 = bcmp((void *)local_128,(this->mDomainName)._M_dataplus._M_p,(size_t)local_120._M_p);
        bVar7 = iVar4 != 0;
      }
    }
    else {
      bVar7 = true;
    }
    if (auVar3 != (undefined1  [8])&local_118) {
      operator_delete((void *)auVar3);
    }
    if (!bVar7) {
      CborValue::Move(&aToken->super_CborValue,&local_b0);
      goto LAB_001c4751;
    }
    ::fmt::v10::detail::
    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_60.handler_ = (format_string_checker<char> *)&stack0xffffffffffffffb0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,local_c8,local_c8 + local_d0);
    local_78 = (this->mDomainName)._M_dataplus._M_p;
    asStack_70[0] = (this->mDomainName)._M_string_length;
    local_88 = local_60.handler_;
    psStack_80 = psStack_58;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x4d;
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)&local_88;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_f0,
               (v10 *)
               "the Domain Name ({}) in COM_TOK doesn\'t match the configured Domain Name ({})",fmt,
               args_01);
    local_128._0_4_ = 6;
    local_120._M_p = (pointer)&local_110;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_f0._0_8_,(pointer)(local_f0._0_8_ + local_f0._8_8_));
    __return_storage_ptr__->mCode = local_128._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_p != &local_110) {
      operator_delete(local_120._M_p);
    }
    if ((format_string_checker<char> *)local_f0._0_8_ !=
        (format_string_checker<char> *)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_);
    }
    local_f0._0_8_ = local_60.handler_;
    if (local_60.handler_ == (format_string_checker<char> *)&stack0xffffffffffffffb0)
    goto LAB_001c4751;
  }
  operator_delete((void *)local_f0._0_8_);
LAB_001c4751:
  CborValue::Free(&local_b0);
  cose::Sign1Message::Free(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::ValidateToken(CborMap                  &aToken,
                                  const ByteArray          &aSignedToken,
                                  const mbedtls_pk_context &aPublicKey) const
{
    Error              error;
    cose::Sign1Message coseSign;
    CborMap            token;
    const uint8_t     *payload;
    size_t             payloadLength;
    const char        *domainName;
    size_t             domainNameLength;
    const char        *expire;
    size_t             expireLength;

    VerifyOrExit(!aSignedToken.empty(), error = ERROR_INVALID_ARGS("the signed COM_TOK is empty"));
    SuccessOrExit(error = cose::Sign1Message::Deserialize(coseSign, aSignedToken));

    SuccessOrExit(error = coseSign.Validate(aPublicKey));

    VerifyOrExit((payload = coseSign.GetPayload(payloadLength)) != nullptr,
                 error = ERROR_BAD_FORMAT("cannot find payload in the signed COM_TOK"));

    SuccessOrExit(error = CborValue::Deserialize(token, payload, payloadLength));

    SuccessOrExit(error = token.Get(cwt::kAud, domainName, domainNameLength));

    SuccessOrExit(error = token.Get(cwt::kExp, expire, expireLength));

    // TODO(wgtdkp): make sure it is not expired

    // Ignore the "iss" (issuer) claim

    if (std::string{domainName, domainNameLength} != mDomainName)
    {
        ExitNow(error = ERROR_SECURITY("the Domain Name ({}) in COM_TOK doesn't match the configured Domain Name ({})",
                                       std::string{domainName, domainNameLength}, mDomainName));
    }

    CborValue::Move(aToken, token);

exit:
    token.Free();
    coseSign.Free();
    return error;
}